

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opusfile.c
# Opt level: O0

int op_granpos_cmp(ogg_int64_t _gp_a,ogg_int64_t _gp_b)

{
  ogg_int64_t _gp_b_local;
  ogg_int64_t _gp_a_local;
  
  if (_gp_a < 0) {
    if (-1 < _gp_b) {
      return 1;
    }
  }
  else if (_gp_b < 0) {
    return -1;
  }
  return (uint)(_gp_b < _gp_a) - (uint)(_gp_a < _gp_b);
}

Assistant:

static int op_granpos_cmp(ogg_int64_t _gp_a,ogg_int64_t _gp_b){
  /*The invalid granule position -1 should behave like NaN: neither greater
     than nor less than any other granule position, nor equal to any other
     granule position, including itself.
    However, that means there isn't anything we could sensibly return from this
     function for it.*/
  OP_ASSERT(_gp_a!=-1);
  OP_ASSERT(_gp_b!=-1);
  /*Handle the wrapping cases.*/
  if(OP_UNLIKELY(_gp_a<0)){
    if(_gp_b>=0)return 1;
    /*Else fall through.*/
  }
  else if(OP_UNLIKELY(_gp_b<0))return -1;
  /*No wrapping case.*/
  return (_gp_a>_gp_b)-(_gp_b>_gp_a);
}